

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateBoolLiteral(ExpressionEvalContext *ctx,ExprBoolLiteral *expression)

{
  ExprBase *pEVar1;
  ExprBoolLiteral *expression_local;
  ExpressionEvalContext *ctx_local;
  
  pEVar1 = &ExpressionContext::get<ExprBoolLiteral>(ctx->ctx)->super_ExprBase;
  ExprBoolLiteral::ExprBoolLiteral
            ((ExprBoolLiteral *)pEVar1,(expression->super_ExprBase).source,
             (expression->super_ExprBase).type,(bool)((expression->super_ExprBase).field_0x29 & 1));
  pEVar1 = CheckType(&expression->super_ExprBase,pEVar1);
  return pEVar1;
}

Assistant:

ExprBase* EvaluateBoolLiteral(ExpressionEvalContext &ctx, ExprBoolLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, expression->value));
}